

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional1.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  PrintNum local_1d9;
  undefined1 local_1d8 [8];
  function<void_(int)> f_display_obj;
  code *local_1b0;
  undefined8 local_1a8;
  type local_1a0;
  undefined1 local_188 [8];
  function<void_(int)> f_add_display3;
  type local_158;
  undefined1 local_140 [8];
  function<void_(int)> f_add_display2;
  undefined1 local_118 [8];
  function<int_(const_Foo_&)> f_num;
  code *pcStack_f0;
  Foo foo;
  undefined1 local_e0 [8];
  function<void_(const_Foo_&,_int)> f_add_display;
  _Bind<void_(*(int))(int)> local_b8;
  undefined1 local_a8 [8];
  function<void_()> f_display_31337;
  undefined1 local_80 [8];
  function<void_()> f_display_42;
  function<void_(int)> nullfun;
  undefined1 local_30 [8];
  function<void_(int)> f_display;
  
  f_display._M_invoker._4_4_ = 0;
  std::function<void(int)>::function<void(&)(int),void>((function<void(int)> *)local_30,print_num);
  std::function<void_(int)>::operator()((function<void_(int)> *)local_30,-9);
  std::function<void_(int)>::function((function<void_(int)> *)&f_display_42._M_invoker);
  bVar1 = std::function::operator_cast_to_bool((function *)&f_display_42._M_invoker);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"HenryDbg::tp1----->");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"HenryDbg::tp2----->");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  std::function<void()>::function<main::__0,void>
            ((function<void()> *)local_80,
             (anon_class_1_0_00000001 *)((long)&f_display_31337._M_invoker + 7));
  std::function<void_()>::operator()((function<void_()> *)local_80);
  f_add_display._M_invoker._4_4_ = 0x7a69;
  std::bind<void(&)(int),int>((_func_void_int *)&local_b8,(int *)print_num);
  std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
            ((function<void()> *)local_a8,&local_b8);
  std::function<void_()>::operator()((function<void_()> *)local_a8);
  pcStack_f0 = Foo::print_add;
  std::function<void(Foo_const&,int)>::function<void(Foo::*)(int)const,void>
            ((function<void(Foo_const&,int)> *)local_e0,
             (offset_in_Foo_to_subr *)&stack0xffffffffffffff10);
  Foo::Foo((Foo *)((long)&f_num._M_invoker + 4),0x4cb2f);
  std::function<void_(const_Foo_&,_int)>::operator()
            ((function<void_(const_Foo_&,_int)> *)local_e0,(Foo *)((long)&f_num._M_invoker + 4),1);
  f_add_display2._M_invoker = (_Invoker_type)0x0;
  std::function<int(Foo_const&)>::function<int_Foo::*,void>
            ((function<int(Foo_const&)> *)local_118,
             (offset_in_Foo_to_int *)&f_add_display2._M_invoker);
  poVar3 = std::operator<<((ostream *)&std::cout,"num_: ");
  iVar2 = std::function<int_(const_Foo_&)>::operator()
                    ((function<int_(const_Foo_&)> *)local_118,(Foo *)((long)&f_num._M_invoker + 4));
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,'\n');
  f_add_display3._M_invoker = Foo::print_add;
  std::bind<void(Foo::*)(int)const,Foo_const&,std::_Placeholder<1>const&>
            (&local_158,(offset_in_Foo_to_subr *)&f_add_display3._M_invoker,
             (Foo *)((long)&f_num._M_invoker + 4),(_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(Foo::*(Foo,std::_Placeholder<1>))(int)const>,void>
            ((function<void(int)> *)local_140,&local_158);
  std::function<void_(int)>::operator()((function<void_(int)> *)local_140,2);
  local_1b0 = Foo::print_add;
  local_1a8 = 0;
  f_display_obj._M_invoker = (_Invoker_type)((long)&f_num._M_invoker + 4);
  std::bind<void(Foo::*)(int)const,Foo_const*,std::_Placeholder<1>const&>
            (&local_1a0,(offset_in_Foo_to_subr *)&local_1b0,(Foo **)&f_display_obj._M_invoker,
             (_Placeholder<1> *)&std::placeholders::_1);
  std::function<void(int)>::
  function<std::_Bind<void(Foo::*(Foo_const*,std::_Placeholder<1>))(int)const>,void>
            ((function<void(int)> *)local_188,&local_1a0);
  std::function<void_(int)>::operator()((function<void_(int)> *)local_188,3);
  std::function<void(int)>::function<PrintNum,void>((function<void(int)> *)local_1d8,&local_1d9);
  std::function<void_(int)>::operator()((function<void_(int)> *)local_1d8,0x12);
  std::function<void_(int)>::~function((function<void_(int)> *)local_1d8);
  std::function<void_(int)>::~function((function<void_(int)> *)local_188);
  std::function<void_(int)>::~function((function<void_(int)> *)local_140);
  std::function<int_(const_Foo_&)>::~function((function<int_(const_Foo_&)> *)local_118);
  std::function<void_(const_Foo_&,_int)>::~function((function<void_(const_Foo_&,_int)> *)local_e0);
  std::function<void_()>::~function((function<void_()> *)local_a8);
  std::function<void_()>::~function((function<void_()> *)local_80);
  std::function<void_(int)>::~function((function<void_(int)> *)&f_display_42._M_invoker);
  std::function<void_(int)>::~function((function<void_(int)> *)local_30);
  return f_display._M_invoker._4_4_;
}

Assistant:

int main()
{
	// store a free function
	std::function<void(int)> f_display = print_num;
	f_display(-9);

	std::function<void(int)> nullfun;
	if (nullfun) {
		std::cout << "HenryDbg::tp1----->" << std::endl;

	} else {
		std::cout << "HenryDbg::tp2----->" << std::endl;
	}

	// store a lambda
	std::function<void()> f_display_42 = []() { print_num(42); };
	f_display_42();

	// store the result of a call to std::bind
	std::function<void()> f_display_31337 = std::bind(print_num, 31337);
	f_display_31337();

	// store a call to a member function
	std::function<void(const Foo&, int)> f_add_display = &Foo::print_add;
	const Foo foo(314159);
	f_add_display(foo, 1);

	// store a call to a data member accessor
	std::function<int(Foo const&)> f_num = &Foo::num_;
	std::cout << "num_: " << f_num(foo) << '\n';

	// store a call to a member function and object
	using std::placeholders::_1;
	std::function<void(int)> f_add_display2 = std::bind( &Foo::print_add, foo, _1 );
	f_add_display2(2);

	// store a call to a member function and object ptr
	std::function<void(int)> f_add_display3 = std::bind( &Foo::print_add, &foo, _1 );
	f_add_display3(3);

	// store a call to a function object
	std::function<void(int)> f_display_obj = PrintNum();
	f_display_obj(18);
}